

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_DoStrifeAdvanceDemo(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FSoundID local_2c;
  FSoundID local_28;
  FSoundID local_24;
  FSoundID local_20;
  FSoundID local_1c;
  FSoundID local_18;
  FSoundID local_14;
  
  gamestate = GS_DEMOSCREEN;
  PageBlank = false;
  switch(demosequence) {
  case 1:
    pagetic = 10;
    PageBlank = true;
    local_14.ID = S_FindSound("bishop/active");
    S_Sound(0x22,&local_14,1.0,1.0);
    pcVar3 = "";
    break;
  case 2:
    pagetic = 0x8c;
    pcVar3 = "RGELOGO";
    break;
  case 3:
    pagetic = 0xf5;
    pcVar3 = "svox/voc91";
    if ((gameinfo.flags & 2U) == 0) {
      pcVar3 = "svox/pro1";
    }
    local_18.ID = S_FindSound(pcVar3);
    S_Sound(0x22,&local_18,1.0,1.0);
    pcVar3 = "d_fmintr";
    if ((gameinfo.flags & 8U) == 0) {
      pcVar3 = "d_intro";
    }
    S_StartMusic(pcVar3);
    pcVar3 = "PANEL1";
    break;
  case 4:
    pagetic = 0x13b;
    pcVar3 = "svox/voc92";
    if ((gameinfo.flags & 2U) == 0) {
      pcVar3 = "svox/pro2";
    }
    local_1c.ID = S_FindSound(pcVar3);
    S_Sound(0x22,&local_1c,1.0,1.0);
    pcVar3 = "PANEL2";
    break;
  case 5:
    pagetic = 0x1a4;
    pcVar3 = "svox/voc93";
    if ((gameinfo.flags & 2U) == 0) {
      pcVar3 = "svox/pro3";
    }
    local_20.ID = S_FindSound(pcVar3);
    S_Sound(0x22,&local_20,1.0,1.0);
    pcVar3 = "PANEL3";
    break;
  case 6:
    pagetic = 0x181;
    pcVar3 = "svox/voc94";
    if ((gameinfo.flags & 2U) == 0) {
      pcVar3 = "svox/pro4";
    }
    local_24.ID = S_FindSound(pcVar3);
    S_Sound(0x22,&local_24,1.0,1.0);
    pcVar3 = "PANEL4";
    break;
  case 7:
    pagetic = 0x15e;
    pcVar3 = "svox/voc95";
    if ((gameinfo.flags & 2U) == 0) {
      pcVar3 = "svox/pro5";
    }
    local_28.ID = S_FindSound(pcVar3);
    S_Sound(0x22,&local_28,1.0,1.0);
    pcVar3 = "PANEL5";
    break;
  case 8:
    pagetic = 0x230;
    pcVar3 = "svox/voc96";
    if ((gameinfo.flags & 2U) == 0) {
      pcVar3 = "svox/pro6";
    }
    local_2c.ID = S_FindSound(pcVar3);
    S_Sound(0x22,&local_2c,1.0,1.0);
    pcVar3 = "PANEL6";
    break;
  case 9:
    pagetic = 0xd2;
    wipegamestate = GS_FORCEWIPEFADE;
    pcVar3 = "vellogo";
    break;
  case 10:
    pagetic = 0x1a4;
    wipegamestate = GS_FORCEWIPEFADE;
    pcVar3 = "CREDIT";
    break;
  default:
    pagetic = 0xd2;
    iVar2 = FWadCollection::CheckNumForName(&Wads,"d_logo",0x10);
    pcVar3 = "";
    if (-1 < iVar2) {
      pcVar3 = "d_logo";
    }
    S_StartMusic(pcVar3);
    C_HideConsole();
    pcVar3 = "TITLEPIC";
  }
  iVar2 = demosequence + 1;
  bVar1 = demosequence < 0xb;
  demosequence = 0;
  if (bVar1) {
    demosequence = iVar2;
  }
  if ((demosequence == 9) && ((gameinfo.flags & 2U) == 0)) {
    demosequence = 10;
  }
  if (Page != (FTexture *)0x0) {
    (*Page->_vptr_FTexture[9])();
    Page = (FTexture *)0x0;
  }
  if (*pcVar3 != '\0') {
    Page = FTextureManager::operator[](&TexMan,pcVar3);
  }
  return;
}

Assistant:

void D_DoStrifeAdvanceDemo ()
{
	static const char *const fullVoices[6] =
	{
		"svox/pro1", "svox/pro2", "svox/pro3", "svox/pro4", "svox/pro5", "svox/pro6"
	};
	static const char *const teaserVoices[6] =
	{
		"svox/voc91", "svox/voc92", "svox/voc93", "svox/voc94", "svox/voc95", "svox/voc96"
	};
	const char *const *voices = gameinfo.flags & GI_SHAREWARE ? teaserVoices : fullVoices;
	const char *pagename = NULL;

	gamestate = GS_DEMOSCREEN;
	PageBlank = false;

	switch (demosequence)
	{
	default:
	case 0:
		pagetic = 6 * TICRATE;
		pagename = "TITLEPIC";
		if (Wads.CheckNumForName ("d_logo", ns_music) < 0)
		{ // strife0.wad does not have d_logo
			S_StartMusic ("");
		}
		else
		{
			S_StartMusic ("d_logo");
		}
		C_HideConsole ();
		break;

	case 1:
		// [RH] Strife fades to black and then to the Rogue logo, but
		// I think it looks better if it doesn't fade.
		pagetic = 10 * TICRATE/35;
		pagename = "";	// PANEL0, but strife0.wad doesn't have it, so don't use it.
		PageBlank = true;
		S_Sound (CHAN_VOICE | CHAN_UI, "bishop/active", 1, ATTN_NORM);
		break;

	case 2:
		pagetic = 4 * TICRATE;
		pagename = "RGELOGO";
		break;

	case 3:
		pagetic = 7 * TICRATE;
		pagename = "PANEL1";
		S_Sound (CHAN_VOICE | CHAN_UI, voices[0], 1, ATTN_NORM);
		// The new Strife teaser has D_FMINTR.
		// The full retail Strife has D_INTRO.
		// And the old Strife teaser has both. (I do not know which one it actually uses, nor do I care.)
		S_StartMusic (gameinfo.flags & GI_TEASER2 ? "d_fmintr" : "d_intro");
		break;

	case 4:
		pagetic = 9 * TICRATE;
		pagename = "PANEL2";
		S_Sound (CHAN_VOICE | CHAN_UI, voices[1], 1, ATTN_NORM);
		break;

	case 5:
		pagetic = 12 * TICRATE;
		pagename = "PANEL3";
		S_Sound (CHAN_VOICE | CHAN_UI, voices[2], 1, ATTN_NORM);
		break;

	case 6:
		pagetic = 11 * TICRATE;
		pagename = "PANEL4";
		S_Sound (CHAN_VOICE | CHAN_UI, voices[3], 1, ATTN_NORM);
		break;

	case 7:
		pagetic = 10 * TICRATE;
		pagename = "PANEL5";
		S_Sound (CHAN_VOICE | CHAN_UI, voices[4], 1, ATTN_NORM);
		break;

	case 8:
		pagetic = 16 * TICRATE;
		pagename = "PANEL6";
		S_Sound (CHAN_VOICE | CHAN_UI, voices[5], 1, ATTN_NORM);
		break;

	case 9:
		pagetic = 6 * TICRATE;
		pagename = "vellogo";
		wipegamestate = GS_FORCEWIPEFADE;
		break;

	case 10:
		pagetic = 12 * TICRATE;
		pagename = "CREDIT";
		wipegamestate = GS_FORCEWIPEFADE;
		break;
	}
	if (demosequence++ > 10)
		demosequence = 0;
	if (demosequence == 9 && !(gameinfo.flags & GI_SHAREWARE))
		demosequence = 10;

	if (pagename)
	{
		if (Page != NULL)
		{
			Page->Unload ();
			Page = NULL;
		}
		if (pagename[0])
		{
			Page = TexMan[pagename];
		}
	}
}